

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::BasicSharedVarCase::iterate(BasicSharedVarCase *this)

{
  size_type *this_00;
  RenderContext *renderCtx;
  Functions *gl;
  int iVar1;
  ContextType type;
  GLSLVersion version;
  GLuint GVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ostream *poVar6;
  ProgramSources *sources;
  TestError *pTVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  allocator<char> local_4d1;
  Functions *local_4d0;
  ulong local_4c8;
  BasicSharedVarCase *local_4c0;
  int local_4b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  Buffer outputBuffer;
  BufferMemMap bufMap;
  undefined1 local_460 [40];
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  ShaderProgram program;
  InterfaceVariableInfo valueInfo;
  ostringstream src;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_4d0 = (Functions *)CONCAT44(extraout_var,iVar1);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  iVar1 = (this->m_localSize).m_data[0];
  iVar13 = (this->m_localSize).m_data[1];
  iVar16 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] *
           (this->m_workSize).m_data[2];
  iVar14 = (this->m_localSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar5 = glu::getGLSLVersionDeclaration(version);
  poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout (local_size_x = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[0]);
  poVar6 = std::operator<<(poVar6,", local_size_y = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[1]);
  poVar6 = std::operator<<(poVar6,", local_size_z = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[2]);
  poVar6 = std::operator<<(poVar6,") in;\n");
  poVar6 = std::operator<<(poVar6,"layout(binding = 0) buffer Output {\n");
  poVar6 = std::operator<<(poVar6,"    uint values[");
  uVar15 = iVar13 * iVar1 * iVar14;
  local_4c8 = (ulong)uVar15;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar16 * uVar15);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"} sb_out;\n\n");
  poVar6 = std::operator<<(poVar6,"shared uint offsets[");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_4c8);
  poVar6 = std::operator<<(poVar6,"];\n\n");
  poVar6 = std::operator<<(poVar6,"void main (void) {\n");
  poVar6 = std::operator<<(poVar6,
                           "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar6 = std::operator<<(poVar6,
                           "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar6 = std::operator<<(poVar6,"    uint globalOffs = localSize*globalNdx;\n");
  poVar6 = std::operator<<(poVar6,
                           "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                          );
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,
                           "    offsets[localSize-localOffs-1u] = globalOffs + localOffs*localOffs;\n"
                          );
  poVar6 = std::operator<<(poVar6,"    barrier();\n");
  poVar6 = std::operator<<(poVar6,
                           "    sb_out.values[globalOffs + localOffs] = offsets[localOffs];\n");
  std::operator<<(poVar6,"}\n");
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  local_460._0_4_ = SHADERTYPE_COMPUTE;
  std::__cxx11::string::string((string *)(local_460 + 8),(string *)&local_4b0);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&valueInfo,(ShaderSource *)local_460);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_460 + 8));
  std::__cxx11::string::~string((string *)&local_4b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  gl = local_4d0;
  if (program.m_program.m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x35c);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Work groups: ");
  tcu::operator<<((ostream *)this_00,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (*gl->useProgram)(program.m_program.m_program);
  GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar2,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar3,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x36a);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x36f);
  GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar2,0x9303);
  GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Output.values");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program.m_program.m_program,0x92e5,GVar2);
  iVar13 = 0;
  local_4c0 = this;
  BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,dVar3,1);
  iVar1 = (int)local_4c8;
  uVar8 = 0;
  if (0 < iVar1) {
    uVar8 = local_4c8 & 0xffffffff;
  }
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  local_4d0 = (Functions *)CONCAT44(local_4d0._4_4_,iVar16);
  iVar14 = 1;
  iVar12 = 0;
  do {
    if (iVar12 == iVar16) {
      BufferMemMap::~BufferMemMap(&bufMap);
      std::__cxx11::string::~string((string *)&valueInfo);
      tcu::TestContext::setTestResult
                ((local_4c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
      glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
      return STOP;
    }
    uVar10 = 0;
    iVar9 = iVar13;
    iVar11 = iVar1;
    while (iVar11 = iVar11 + -1, uVar8 != uVar10) {
      lVar17 = (long)iVar9;
      uVar10 = uVar10 + 1;
      iVar9 = iVar9 + valueInfo.arrayStride;
      if (*(int *)((long)bufMap.m_ptr + lVar17 + (ulong)valueInfo.offset) !=
          iVar11 * iVar11 + iVar12 * iVar1) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Comparison failed for Output.values[",&local_4d1);
        local_4b4 = (int)uVar10 - iVar14;
        de::toString<int>(&local_438,&local_4b4);
        std::operator+(&local_4b0,&local_418,&local_438);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_4b0,"]");
        tcu::TestError::TestError(pTVar7,(string *)local_460);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    iVar12 = iVar12 + 1;
    iVar14 = iVar14 - iVar1;
    iVar13 = iVar13 + iVar1 * valueInfo.arrayStride;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "shared uint offsets[" << workGroupSize << "];\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    offsets[localSize-localOffs-1u] = globalOffs + localOffs*localOffs;\n"
			<< "    barrier();\n"
			<< "    sb_out.values[globalOffs + localOffs] = offsets[localOffs];\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			for (int groupNdx = 0; groupNdx < workGroupCount; groupNdx++)
			{
				for (int localOffs = 0; localOffs < workGroupSize; localOffs++)
				{
					const int		globalOffs	= groupNdx*workGroupSize;
					const deUint32	res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*(globalOffs + localOffs)));
					const deUint32	ref			= (deUint32)(globalOffs + (workGroupSize-localOffs-1)*(workGroupSize-localOffs-1));

					if (res != ref)
						throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(globalOffs + localOffs) + "]");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}